

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O1

void Eigen::internal::
     generic_product_impl<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>>,Eigen::Matrix<float,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Matrix<float,_1,1,0,_1,1>>
               (Matrix<float,__1,_1,_0,__1,_1> *dst,
               Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *lhs,
               Matrix<float,__1,_1,_0,__1,_1> *rhs,Scalar *alpha)

{
  non_const_type pMVar1;
  float *pfVar2;
  char *__function;
  float fVar3;
  LhsNested actual_lhs;
  scalar_sum_op<float,_float> local_bd;
  Scalar local_bc;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>_>
  local_b8;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
  local_40;
  
  pMVar1 = lhs->m_matrix;
  if ((pMVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
      1) {
    local_b8.m_lhs.m_matrix.
    super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
    .m_data = (PointerType)lhs->m_matrix;
    gemv_dense_selector<2,1,true>::
    run<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,_1,1,0,_1,1>>
              ((Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&local_b8,rhs,dst,alpha);
    return;
  }
  local_b8.m_lhs.m_matrix.
  super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
  .m_data = (pMVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
            m_data;
  local_b8.m_lhs.m_matrix.
  super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
  .
  super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
  .m_cols.m_value =
       (pMVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if (local_b8.m_lhs.m_matrix.
      super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
      .
      super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
      .m_cols.m_value < 0 &&
      local_b8.m_lhs.m_matrix.
      super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
      .
      super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
      .m_data != (float *)0x0) {
    __function = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, 1, -1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, 1, -1, true>, Level = 0]"
    ;
  }
  else {
    local_b8.m_lhs.m_matrix.
    super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
    .m_xpr.m_matrix = lhs->m_matrix;
    if (((local_b8.m_lhs.m_matrix.
          super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
          .m_xpr.m_matrix)->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
        m_storage.m_cols < 1) {
      __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                    ,0x7a,
                    "Eigen::Block<const Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, 1, -1, true>::Block(XprType &, Index) [XprType = const Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, BlockRows = 1, BlockCols = -1, InnerPanel = true]"
                   );
    }
    local_b8.m_rhs.
    super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>,_0>.m_data
         = (rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_b8.m_rhs.
    super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>,_0>.m_rows.
    m_value = (rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (-1 < local_b8.m_rhs.
             super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_Eigen::Dense>
             .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_true>.
             super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>,_0>
             .m_rows.m_value ||
        local_b8.m_rhs.
        super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>,_0>.
        m_data == (float *)0x0) {
      if (local_b8.m_lhs.m_matrix.
          super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
          .m_cols.m_value !=
          local_b8.m_rhs.
          super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>,_0>.
          m_rows.m_value) {
        __assert_fail("size() == other.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Dot.h"
                      ,0x52,
                      "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Block<const Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, 1, -1, true>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Block<const Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, 1, -1, true>, OtherDerived = Eigen::Block<const Eigen::Matrix<float, -1, 1>, -1, 1, true>]"
                     );
      }
      local_bc = *alpha;
      local_b8.m_lhs.m_matrix.
      super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
      .m_outerStride =
           ((local_b8.m_lhs.m_matrix.
             super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
             .m_xpr.m_matrix)->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
           m_storage.m_rows;
      local_b8.m_lhs.m_matrix.
      super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
      .m_startRow.m_value = 0;
      local_b8.m_lhs.m_matrix.
      super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
      .m_startCol.m_value = 0;
      local_b8.m_rhs.
      super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_true>.
      m_startRow.m_value = 0;
      if (local_b8.m_rhs.
          super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>,_0>.
          m_rows.m_value == 0) {
        fVar3 = 0.0;
      }
      else {
        local_b8.m_rhs.
        super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_true>.m_xpr
             = rhs;
        local_b8.m_rhs.
        super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_true>.
        m_outerStride =
             local_b8.m_rhs.
             super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_Eigen::Dense>
             .super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_true>.
             super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>,_0>
             .m_rows.m_value;
        if (local_b8.m_rhs.
            super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_Eigen::Dense>.
            super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_true>.
            super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>,_0>
            .m_rows.m_value < 1) {
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Redux.h"
                        ,0x19b,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, 1, -1, true>>, const Eigen::Block<const Eigen::Matrix<float, -1, 1>, -1, 1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, 1, -1, true>>, const Eigen::Block<const Eigen::Matrix<float, -1, 1>, -1, 1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<float>]"
                       );
        }
        local_40.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
        .m_d.lhsImpl.
        super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>_>
        .
        super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_float>
        .m_argImpl.
        super_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>
        .
        super_block_evaluator<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
        .
        super_mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>
        .m_outerStride.m_value =
             ((local_b8.m_lhs.m_matrix.
               super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
               .m_xpr.m_matrix)->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
             m_storage.m_rows;
        local_40.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
        .m_d.rhsImpl.
        super_evaluator<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>_>.
        super_block_evaluator<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_true>.
        super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
        .m_outerStride.m_value =
             (rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
        local_40.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
        .m_d.lhsImpl.
        super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>_>
        .
        super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_Eigen::internal::IndexBased,_float>
        .m_argImpl.
        super_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>
        .
        super_block_evaluator<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
        .
        super_mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>
        .m_data = local_b8.m_lhs.m_matrix.
                  super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>,_0>
                  .m_data;
        local_40.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
        .m_d.rhsImpl.
        super_evaluator<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>_>.
        super_block_evaluator<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_true>.
        super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
        .m_data = local_b8.m_rhs.
                  super_BlockImpl<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_true>,_0>
                  .m_data;
        fVar3 = redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>>const,1,-1,true>const>const,Eigen::Block<Eigen::Matrix<float,-1,1,0,-1,1>const,-1,1,true>const>>,3,0>
                ::
                run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>const,1,_1,true>const>const,Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>const,_1,1,true>const>>
                          (&local_40,&local_bd,&local_b8);
      }
      pfVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      *pfVar2 = local_bc * fVar3 + *pfVar2;
      return;
    }
    __function = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<float, -1, 1>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<float, -1, 1>, -1, 1, true>, Level = 0]"
    ;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                ,0xb2,__function);
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }